

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unique_handle.cpp
# Opt level: O2

void CATCH2_INTERNAL_TEMPLATE_TEST_65<sl::nullhandle_t,false>(void)

{
  StringRef macroName;
  StringRef capturedExpression;
  ITransientExpression local_80;
  char *local_70;
  undefined8 local_68;
  undefined1 local_60;
  AssertionHandler catchAssertionHandler;
  
  local_80._vptr_ITransientExpression = (_func_int **)0x303beb;
  local_80.m_isBinaryExpression = true;
  local_80.m_result = true;
  local_80._10_6_ = 0;
  macroName.m_size = 7;
  macroName.m_start = "REQUIRE";
  capturedExpression.m_size = 0x13;
  capturedExpression.m_start = "result == VExpected";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_80,capturedExpression,Normal)
  ;
  local_80._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_003ccaa0;
  local_80._8_3_ = 0x101;
  local_70 = "==";
  local_68 = 2;
  local_60 = 0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_80);
  Catch::ITransientExpression::~ITransientExpression(&local_80);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

constexpr value_t(int a)
			: a{ a }
		{ }